

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderFps(CHud *this)

{
  ITextRender *pIVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  float fVar4;
  char aBuf [32];
  char acStack_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClShowfps != 0) {
    if (RenderFps()::s_Cursor == '\0') {
      iVar2 = __cxa_guard_acquire(&RenderFps()::s_Cursor);
      if (iVar2 != 0) {
        CTextCursor::CTextCursor(&RenderFps::s_Cursor,12.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderFps::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderFps()::s_Cursor);
      }
    }
    RenderFps::s_Cursor.m_Align = 2;
    RenderFps::s_Cursor.m_CursorPos.field_0.x = this->m_Width + -10.0;
    RenderFps::s_Cursor.m_CursorPos.field_1.y = 5.0;
    auVar3._4_4_ = this->m_AverageFPS;
    auVar3._0_4_ = ((this->super_CComponent).m_pClient)->m_pClient->m_RenderFrameTime;
    auVar3._8_8_ = 0;
    auVar3 = divps(_DAT_001d43d0,auVar3);
    fVar4 = (1.0 - auVar3._4_4_) * this->m_AverageFPS + auVar3._4_4_ * auVar3._0_4_;
    this->m_AverageFPS = fVar4;
    str_format(acStack_48,0x20,"%d",(ulong)(uint)(int)fVar4);
    CTextCursor::Reset(&RenderFps::s_Cursor,-1);
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0xb])
              (pIVar1,&RenderFps::s_Cursor,acStack_48,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderFps()
{
	if(Config()->m_ClShowfps)
	{
		static CTextCursor s_Cursor(12);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		s_Cursor.MoveTo(m_Width-10, 5);

		// calculate avg. fps
		float FPS = 1.0f / Client()->RenderFrameTime();
		m_AverageFPS = (m_AverageFPS*(1.0f-(1.0f/m_AverageFPS))) + (FPS*(1.0f/m_AverageFPS));
		char aBuf[32];
		str_format(aBuf, sizeof(aBuf), "%d", (int)m_AverageFPS);

		s_Cursor.Reset();
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}